

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

int EncodeData(BrotliEncoderStateInternal *s,int is_last,int force_flush,size_t *out_size,
              uint8_t **output)

{
  MemoryManager *m;
  Hasher *hasher;
  size_t *last_insert_len;
  size_t *num_literals;
  long lVar1;
  uint8_t uVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  uint8_t *data;
  uint32_t *puVar6;
  uint16_t *puVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  ContextType literal_context_mode;
  uint32_t *buckets_2;
  uint32_t *puVar19;
  uint8_t *puVar20;
  int *piVar21;
  Command *pCVar22;
  void *pvVar23;
  byte bVar24;
  char cVar25;
  int iVar26;
  uint uVar27;
  BrotliEncoderParams *pBVar28;
  BrotliEncoderParams *extraout_RDX;
  BrotliEncoderParams *params;
  long lVar29;
  uint8_t *puVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  void *pvVar34;
  uint32_t uVar35;
  uint uVar36;
  size_t sVar37;
  Hasher *pHVar38;
  size_t *psVar39;
  uint32_t **ppuVar40;
  HasherCommon *pHVar41;
  ulong uVar42;
  uint8_t *s1_orig;
  uint8_t *puVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong mask;
  uint8_t **ppuVar48;
  ulong uVar49;
  int *piVar50;
  bool bVar51;
  bool bVar52;
  void *pvVar53;
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  BrotliHasherParams *pBVar58;
  double dVar59;
  ulong local_a70;
  BrotliHasherParams *local_a50;
  size_t storage_ix_1;
  double local_a40;
  ulong local_a38;
  uint8_t **local_a30;
  BrotliHasherParams *local_a28;
  double dStack_a20;
  size_t local_a18;
  uint32_t *local_a10;
  void *local_a08;
  Command *local_a00;
  ulong local_9f8;
  int *local_9f0;
  uint32_t wrapped_last_processed_pos;
  uint32_t bytes;
  int *local_9e0;
  size_t *local_9d8;
  ContextLut local_9d0;
  uint32_t *local_9c8;
  size_t num_literal_contexts;
  size_t storage_ix;
  BrotliEncoderParams *pBStack_9b0;
  size_t local_9a8;
  size_t sStack_9a0;
  uint32_t local_974;
  size_t table_size;
  uint auStack_430 [10];
  BlockSplit local_408;
  BlockSplit local_3d8;
  uint32_t *local_3a8;
  size_t sStack_3a0;
  uint32_t *local_398;
  size_t sStack_390;
  HistogramLiteral *local_388;
  size_t sStack_380;
  HistogramCommand *local_378;
  size_t sStack_370;
  HistogramDistance *local_368;
  size_t sStack_360;
  
  bVar24 = 0;
  local_a38 = (ulong)(uint)is_last;
  uVar33 = s->last_processed_pos_;
  uVar49 = s->input_pos_ - uVar33;
  uVar27 = (uint)uVar49;
  uVar32 = (uint)uVar33;
  if (2 < uVar33 >> 0x1e) {
    uVar32 = ((int)(uVar32 * 2) >> 1 & 0xc0000000U) + (uVar32 & 0x3fffffff) + 0x80000000;
  }
  uVar17 = (s->params).quality;
  data = (s->ringbuffer_).buffer_;
  uVar5 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar5;
  if (s->input_pos_ == uVar33) {
    if (data == (uint8_t *)0x0) {
      if (is_last != 0) {
        uVar16 = (ushort)(3 << (s->last_bytes_bits_ & 0x1f)) | s->last_bytes_;
        s->last_bytes_ = uVar16;
        bVar24 = s->last_bytes_bits_ + 2;
        s->last_bytes_bits_ = bVar24;
        (s->tiny_buf_).u8[0] = (uint8_t)uVar16;
        (s->tiny_buf_).u8[1] = (uint8_t)(uVar16 >> 8);
        *output = (uint8_t *)&s->tiny_buf_;
        *out_size = (ulong)(bVar24 + 7 >> 3);
        return 1;
      }
      goto LAB_010fc54b;
    }
    if ((is_last == 0) && (force_flush == 0 || uVar17 < 2)) goto LAB_010fc54b;
  }
  if ((s->params).dictionary.max_quality < (int)uVar17) {
    return 0;
  }
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar49) {
    return 0;
  }
  local_a30 = output;
  wrapped_last_processed_pos = uVar32;
  bytes = uVar27;
  local_9d8 = out_size;
  if (uVar17 == 0) {
LAB_010faa8a:
    storage_ix = (size_t)s->last_bytes_bits_;
    puVar20 = GetBrotliStorage(s,(ulong)(uVar27 * 2 + 0x1f7));
    *puVar20 = (uint8_t)s->last_bytes_;
    puVar20[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
    uVar49 = uVar49 & 0xffffffff;
    piVar21 = GetHashTable(s,(s->params).quality,uVar49,&table_size);
    if ((s->params).quality == 0) {
      duckdb_brotli::BrotliCompressFragmentFast
                (s->one_pass_arena_,data + (uVar32 & uVar5),uVar49,is_last,piVar21,table_size,
                 &storage_ix,puVar20);
    }
    else {
      duckdb_brotli::BrotliCompressFragmentTwoPass
                (s->two_pass_arena_,data + (uVar32 & uVar5),uVar49,is_last,s->command_buf_,
                 s->literal_buf_,piVar21,table_size,&storage_ix,puVar20);
    }
    uVar33 = storage_ix >> 3;
    s->last_bytes_ = (ushort)puVar20[uVar33];
    s->last_bytes_bits_ = (byte)storage_ix & 7;
    UpdateLastProcessedPos(s);
    *local_a30 = puVar20;
    *local_9d8 = uVar33;
    return 1;
  }
  m = &s->memory_manager_;
  if (uVar17 == 1) {
    if (s->command_buf_ == (uint32_t *)0x0) {
      puVar19 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar19;
      puVar20 = (uint8_t *)duckdb_brotli::BrotliAllocate(m,0x20000);
      s->literal_buf_ = puVar20;
    }
    goto LAB_010faa8a;
  }
  uVar33 = s->num_commands_ + (uVar49 >> 1 & 0x7fffffff) + 1;
  local_9f0 = (int *)CONCAT44(local_9f0._4_4_,force_flush);
  if (s->cmd_alloc_size_ < uVar33) {
    sVar37 = (uVar49 >> 2 & 0x3fffffff) + uVar33 + 0x10;
    s->cmd_alloc_size_ = sVar37;
    if (sVar37 == 0) {
      pCVar22 = (Command *)0x0;
    }
    else {
      pCVar22 = (Command *)duckdb_brotli::BrotliAllocate(m,sVar37 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      switchD_00b041bd::default(pCVar22,s->commands_,s->num_commands_ << 4);
      duckdb_brotli::BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar22;
  }
  hasher = &s->hasher_;
  pvVar53 = (void *)(ulong)uVar32;
  uVar49 = uVar49 & 0xffffffff;
  bVar51 = uVar32 == 0;
  bVar52 = (int)local_a38 != 0;
  if ((s->hasher_).common.is_setup_ == 0) {
    local_9a8 = 0;
    sStack_9a0 = 0;
    storage_ix = 0;
    pBStack_9b0 = (BrotliEncoderParams *)0x0;
    pBVar58 = &(s->params).hasher;
    uVar17 = (s->params).quality;
    pBVar28 = (BrotliEncoderParams *)(ulong)uVar17;
    if ((int)uVar17 < 10) {
      if (uVar17 == 4) {
        if ((s->params).size_hint < 0x100000) {
LAB_010fad46:
          pBVar58->type = uVar17;
        }
        else {
          pBVar58->type = 0x36;
          pBVar28 = (BrotliEncoderParams *)0x36;
        }
      }
      else {
        if ((int)uVar17 < 5) goto LAB_010fad46;
        uVar36 = (s->params).lgwin;
        if ((int)uVar36 < 0x11) {
          pBVar28 = (BrotliEncoderParams *)&DAT_00000028;
          if (6 < uVar17) {
            pBVar28 = (BrotliEncoderParams *)(ulong)(0x2a - (uVar17 < 9));
          }
          pBVar58->type = (int)pBVar28;
        }
        else if ((uVar36 < 0x13) || ((s->params).size_hint < 0x100000)) {
          iVar18 = 0x10;
          if (uVar17 < 9) {
            iVar18 = 10;
          }
          (s->params).hasher.type = 5;
          (s->params).hasher.block_bits = uVar17 - 1;
          (s->params).hasher.bucket_bits = 0xf - (uint)(uVar17 < 7);
          iVar26 = 4;
          if (6 < uVar17) {
            iVar26 = iVar18;
          }
          (s->params).hasher.num_last_distances_to_check = iVar26;
          pBVar28 = (BrotliEncoderParams *)&DAT_00000005;
        }
        else {
          (s->params).hasher.type = 6;
          (s->params).hasher.bucket_bits = 0xf;
          (s->params).hasher.block_bits = uVar17 - 1;
          iVar18 = 0x10;
          if (uVar17 < 9) {
            iVar18 = 10;
          }
          iVar26 = 4;
          if (6 < uVar17) {
            iVar26 = iVar18;
          }
          (s->params).hasher.num_last_distances_to_check = iVar26;
          pBVar28 = (BrotliEncoderParams *)0x6;
        }
      }
    }
    else {
      pBVar58->type = 10;
      pBVar28 = (BrotliEncoderParams *)0xa;
    }
    iVar18 = (s->params).lgwin;
    iVar26 = (int)pBVar28;
    if (iVar18 < 0x19) {
LAB_010fae52:
      iVar13 = pBVar58->bucket_bits;
      iVar14 = (s->params).hasher.block_bits;
      iVar15 = (s->params).hasher.num_last_distances_to_check;
      (s->hasher_).common.params.type = pBVar58->type;
      (s->hasher_).common.params.bucket_bits = iVar13;
      (s->hasher_).common.params.block_bits = iVar14;
      (s->hasher_).common.params.num_last_distances_to_check = iVar15;
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
      params = (BrotliEncoderParams *)&switchD_010fae8c::switchdataD_013a67b8;
      switch(iVar26) {
      case 2:
      case 3:
        storage_ix = 0x40000;
        break;
      case 4:
        storage_ix = 0x80000;
        break;
      case 5:
      case 6:
        bVar3 = (byte)(s->params).hasher.bucket_bits;
        storage_ix = 2L << (bVar3 & 0x3f);
        pBStack_9b0 = (BrotliEncoderParams *)
                      ((4L << (bVar3 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
        params = pBStack_9b0;
        break;
      case 7:
      case 8:
      case 9:
        break;
      case 10:
        uVar44 = 1L << ((byte)iVar18 & 0x3f);
        uVar33 = uVar49;
        if (uVar44 < uVar49) {
          uVar33 = uVar44;
        }
        if (!bVar52 || !bVar51) {
          uVar33 = uVar44;
        }
        storage_ix = 0x80000;
        pBStack_9b0 = (BrotliEncoderParams *)(uVar33 << 3);
        break;
      default:
        params = pBVar28;
        switch(iVar26) {
        case 0x23:
switchD_010faeb9_caseD_23:
          storage_ix = 0x40000;
          goto LAB_010faf90;
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
          break;
        case 0x28:
        case 0x29:
          storage_ix = 0x40000;
          pBStack_9b0 = (BrotliEncoderParams *)0x40000;
          break;
        case 0x2a:
          storage_ix = 0x40000;
          pBStack_9b0 = (BrotliEncoderParams *)&duckdb::ScalarFunction::~ScalarFunction;
          break;
        default:
          if (iVar26 == 0x36) {
            storage_ix = 0x400000;
          }
        }
      }
    }
    else if (iVar26 == 0x36) {
      (s->params).hasher.type = 0x37;
      iVar18 = pBVar58->bucket_bits;
      iVar26 = (s->params).hasher.block_bits;
      iVar13 = (s->params).hasher.num_last_distances_to_check;
      (s->hasher_).common.params.type = pBVar58->type;
      (s->hasher_).common.params.bucket_bits = iVar18;
      (s->hasher_).common.params.block_bits = iVar26;
      (s->hasher_).common.params.num_last_distances_to_check = iVar13;
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
      storage_ix = 0x400000;
LAB_010faf90:
      pBStack_9b0 = (BrotliEncoderParams *)0x0;
      local_9a8 = 0x4000000;
      sStack_9a0 = 0;
      params = pBVar28;
    }
    else {
      if (iVar26 != 6) {
        if (iVar26 != 3) goto LAB_010fae52;
        (s->params).hasher.type = 0x23;
        iVar18 = pBVar58->bucket_bits;
        iVar26 = (s->params).hasher.block_bits;
        iVar13 = (s->params).hasher.num_last_distances_to_check;
        (s->hasher_).common.params.type = pBVar58->type;
        (s->hasher_).common.params.bucket_bits = iVar18;
        (s->hasher_).common.params.block_bits = iVar26;
        (s->hasher_).common.params.num_last_distances_to_check = iVar13;
        (s->hasher_).common.dict_num_lookups = 0;
        (s->hasher_).common.dict_num_matches = 0;
        goto switchD_010faeb9_caseD_23;
      }
      (s->params).hasher.type = 0x41;
      iVar18 = pBVar58->bucket_bits;
      iVar26 = (s->params).hasher.block_bits;
      iVar13 = (s->params).hasher.num_last_distances_to_check;
      (s->hasher_).common.params.type = pBVar58->type;
      (s->hasher_).common.params.bucket_bits = iVar18;
      (s->hasher_).common.params.block_bits = iVar26;
      (s->hasher_).common.params.num_last_distances_to_check = iVar13;
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
      bVar3 = (byte)(s->params).hasher.bucket_bits;
      storage_ix = 2L << (bVar3 & 0x3f);
      pBStack_9b0 = (BrotliEncoderParams *)
                    ((4L << (bVar3 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
      local_9a8 = 0x4000000;
      sStack_9a0 = 0;
      params = (BrotliEncoderParams *)storage_ix;
    }
    local_a28 = &(s->hasher_).common.params;
    sStack_9a0 = 0;
    lVar31 = 0;
    do {
      if ((&storage_ix)[lVar31] != 0) {
        pvVar23 = duckdb_brotli::BrotliAllocate(m,(&storage_ix)[lVar31]);
        (s->hasher_).common.extra[lVar31] = pvVar23;
        params = extraout_RDX;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != 4);
    iVar18 = local_a28->type;
    if (iVar18 < 0x23) {
      switch(iVar18) {
      case 2:
      case 3:
      case 4:
switchD_010fb0f9_caseD_2:
        (s->hasher_).privat._H2.common = &hasher->common;
        puVar19 = (uint32_t *)(s->hasher_).common.extra[0];
LAB_010fb17a:
        (s->hasher_).privat._H2.buckets_ = puVar19;
        break;
      case 5:
        duckdb_brotli::InitializeH5(&hasher->common,&(s->hasher_).privat._H5,params);
        break;
      case 6:
        duckdb_brotli::InitializeH6(&hasher->common,&(s->hasher_).privat._H6,params);
        break;
      case 10:
        pvVar23 = (s->hasher_).common.extra[1];
        iVar18 = (s->params).lgwin;
        (s->hasher_).privat._H2.buckets_ = (uint32_t *)(s->hasher_).common.extra[0];
        (s->hasher_).privat._H40.extra[1] = pvVar23;
        uVar17 = -1 << ((byte)iVar18 & 0x1f);
        *(ulong *)&(s->hasher_).privat = (ulong)~uVar17;
        (s->hasher_).privat._H5.hash_shift_ = uVar17 + 1;
      }
    }
    else if (iVar18 < 0x36) {
      switch(iVar18) {
      case 0x23:
switchD_010fb0a5_caseD_23:
        (s->hasher_).privat._H35.common = &hasher->common;
        pHVar38 = hasher;
        ppuVar40 = &(s->hasher_).privat._H6.buckets_;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          *ppuVar40 = (uint32_t *)(pHVar38->common).extra[0];
          pHVar38 = (Hasher *)((long)pHVar38 + (ulong)bVar24 * -0x10 + 8);
          ppuVar40 = ppuVar40 + (ulong)bVar24 * -2 + 1;
        }
        pHVar38 = hasher;
        pHVar41 = &(s->hasher_).privat._H35.hb_common;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          pHVar41->extra[0] = (pHVar38->common).extra[0];
          pHVar38 = (Hasher *)((long)pHVar38 + (ulong)bVar24 * -0x10 + 8);
          pHVar41 = (HasherCommon *)((long)pHVar41 + ((ulong)bVar24 * -2 + 1) * 8);
        }
        (s->hasher_).privat._H35.fresh = 1;
        (s->hasher_).privat._H35.params = &s->params;
        break;
      case 0x28:
      case 0x29:
        iVar18 = (s->params).quality;
        (s->hasher_).privat._H5.common_ = &hasher->common;
        pvVar23 = (s->hasher_).common.extra[1];
        (s->hasher_).privat._H6.hash_mul_ = (uint64_t)(s->hasher_).common.extra[0];
        (s->hasher_).privat._H40.extra[1] = pvVar23;
        puVar19 = (uint32_t *)(ulong)((iVar18 < 7) + 7 << ((char)iVar18 - 4U & 0x1f));
        goto LAB_010fb17a;
      case 0x2a:
        iVar18 = (s->params).quality;
        (s->hasher_).privat._H42.common = &hasher->common;
        pvVar23 = (s->hasher_).common.extra[1];
        (s->hasher_).privat._H42.extra[0] = (s->hasher_).common.extra[0];
        (s->hasher_).privat._H42.extra[1] = pvVar23;
        *(ulong *)((long)&(s->hasher_).privat + 0x400) =
             (ulong)((iVar18 < 7) + 7 << ((char)iVar18 - 4U & 0x1f));
      }
    }
    else {
      if (iVar18 == 0x36) goto switchD_010fb0f9_caseD_2;
      if (iVar18 == 0x37) goto switchD_010fb0a5_caseD_23;
      if (iVar18 == 0x41) {
        (s->hasher_).privat._H65.common = &hasher->common;
        pHVar38 = hasher;
        psVar39 = &(s->hasher_).privat._H35.ha_common.dict_num_matches;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          *psVar39 = (size_t)(pHVar38->common).extra[0];
          pHVar38 = (Hasher *)((long)pHVar38 + (ulong)bVar24 * -0x10 + 8);
          psVar39 = psVar39 + (ulong)bVar24 * -2 + 1;
        }
        pHVar38 = hasher;
        psVar39 = &(s->hasher_).privat._H35.hb_common.dict_num_matches;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          *psVar39 = (size_t)(pHVar38->common).extra[0];
          pHVar38 = (Hasher *)((long)pHVar38 + (ulong)bVar24 * -0x10 + 8);
          psVar39 = psVar39 + (ulong)bVar24 * -2 + 1;
        }
        (s->hasher_).privat._H65.fresh = 1;
        (s->hasher_).privat._H65.params = &s->params;
      }
    }
    (s->hasher_).common.is_prepared_ = 0;
    (s->hasher_).common.is_setup_ = 1;
LAB_010fb273:
    local_9e0 = &(s->hasher_).common.is_prepared_;
    uVar17 = (uint)(bVar52 && bVar51);
    iVar18 = (s->hasher_).common.params.type;
    if (iVar18 < 0x23) {
      switch(iVar18) {
      case 2:
        puVar19 = (s->hasher_).privat._H2.buckets_;
        if ((uVar27 < 0x801) && (bVar52 && bVar51)) {
          if (uVar49 != 0) {
            uVar33 = 0;
            do {
              puVar19[(ulong)(*(long *)(data + uVar33) * 0x7bd3579bd3000000) >> 0x30] = 0;
              uVar33 = uVar33 + 1;
            } while (uVar49 != uVar33);
          }
        }
        else {
LAB_010fb3c2:
          switchD_00569a20::default(puVar19,0,0x40000);
        }
        break;
      case 3:
        puVar19 = (s->hasher_).privat._H2.buckets_;
        if ((0x800 < uVar27) || (!bVar52 || !bVar51)) goto LAB_010fb3c2;
        if (uVar49 != 0) {
          uVar33 = 0;
          do {
            lVar31 = *(long *)(data + uVar33);
            puVar19[(ulong)(lVar31 * 0x7bd3579bd3000000) >> 0x30] = 0;
            puVar19[(ushort)((ulong)(lVar31 * 0x7bd3579bd3000000) >> 0x30) + 8 & 0xffff] = 0;
            uVar33 = uVar33 + 1;
          } while (uVar49 != uVar33);
        }
        break;
      case 4:
        duckdb_brotli::PrepareH4((H4 *)(s->hasher_).privat._H35.ha.buckets_,uVar17,uVar49,data);
        break;
      case 5:
        duckdb_brotli::PrepareH5(&(s->hasher_).privat._H5,uVar17,uVar49,data);
        break;
      case 6:
        duckdb_brotli::PrepareH6(&(s->hasher_).privat._H6,uVar17,uVar49,data);
        break;
      case 10:
        puVar19 = (s->hasher_).privat._H2.buckets_;
        uVar35 = (s->hasher_).privat._H5.hash_shift_;
        lVar31 = 0;
        do {
          puVar6 = puVar19 + lVar31;
          *puVar6 = uVar35;
          puVar6[1] = uVar35;
          puVar6[2] = uVar35;
          puVar6[3] = uVar35;
          lVar31 = lVar31 + 4;
        } while (lVar31 != 0x20000);
      }
    }
    else if (iVar18 < 0x36) {
      switch(iVar18) {
      case 0x23:
        duckdb_brotli::PrepareH35(&(s->hasher_).privat._H35,uVar17,uVar49,data);
        break;
      case 0x28:
        duckdb_brotli::PrepareH40(&(s->hasher_).privat._H40,uVar17,uVar49,data);
        break;
      case 0x29:
        duckdb_brotli::PrepareH41(&(s->hasher_).privat._H41,uVar17,uVar49,data);
        break;
      case 0x2a:
        duckdb_brotli::PrepareH42(&(s->hasher_).privat._H42,uVar17,uVar49,data);
      }
    }
    else if (iVar18 == 0x36) {
      duckdb_brotli::PrepareH54((H54 *)(s->hasher_).privat._H35.ha.buckets_,uVar17,uVar49,data);
    }
    else if (iVar18 == 0x37) {
      duckdb_brotli::PrepareH55(&(s->hasher_).privat._H55,uVar17,uVar49,data);
    }
    else if (iVar18 == 0x41) {
      duckdb_brotli::PrepareH65(&(s->hasher_).privat._H65,uVar17,uVar49,data);
    }
    *local_9e0 = 1;
  }
  else {
    local_9e0 = &(s->hasher_).common.is_prepared_;
    if ((s->hasher_).common.is_prepared_ == 0) goto LAB_010fb273;
  }
  iVar18 = (s->hasher_).common.params.type;
  if (iVar18 < 0x23) {
    switch(iVar18) {
    case 2:
      if ((6 < uVar27) && (2 < uVar32)) {
        puVar19 = (s->hasher_).privat._H2.buckets_;
        puVar19[(ulong)(*(long *)(data + (uVar32 - 3 & uVar5)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar32 - 3;
        puVar19[(ulong)(*(long *)(data + (uVar32 - 2 & uVar5)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar32 - 2;
        puVar19[(ulong)(*(long *)(data + (uVar32 - 1 & uVar5)) * 0x7bd3579bd3000000) >> 0x30] =
             uVar32 - 1;
      }
      break;
    case 3:
      if ((6 < uVar27) && (2 < uVar32)) {
        uVar27 = uVar32 - 3;
        puVar19 = (s->hasher_).privat._H2.buckets_;
        uVar17 = 0xffff;
        puVar19[(uint)(ushort)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar27 & 8) & 0xffff] = uVar27;
        uVar27 = uVar32 - 2;
        puVar19[(uint)(ushort)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar27 & 8) & 0xffff] = uVar27;
        uVar27 = (uint)(ushort)((ulong)(*(long *)(data + (uVar32 - 1 & uVar5)) * 0x7bd3579bd3000000)
                               >> 0x30);
        uVar36 = uVar32 - 1 & 8;
LAB_010fc0e5:
        puVar19[uVar27 + uVar36 & uVar17] = uVar32 - 1;
      }
      break;
    case 4:
      if ((6 < uVar27) && (2 < uVar32)) {
        uVar27 = uVar32 - 3;
        puVar19 = (s->hasher_).privat._H2.buckets_;
        uVar17 = 0x1ffff;
        puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >> 0x2f) +
                (uVar27 & 0x18) & 0x1ffff] = uVar27;
        uVar27 = uVar32 - 2;
        puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >> 0x2f) +
                (uVar27 & 0x18) & 0x1ffff] = uVar27;
        uVar27 = (uint)((ulong)(*(long *)(data + (uVar32 - 1 & uVar5)) * 0x7bd3579bd3000000) >> 0x2f
                       );
LAB_010fc0df:
        uVar36 = uVar32 - 1 & 0x18;
        goto LAB_010fc0e5;
      }
      break;
    case 5:
      if ((2 < uVar27) && (2 < uVar32)) {
        uVar27 = (uint)(*(int *)(data + (uVar32 - 3 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        puVar7 = (s->hasher_).privat._H5.num_;
        uVar16 = puVar7[uVar27];
        puVar19 = (s->hasher_).privat._H5.buckets_;
        puVar19[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
                (ulong)(uVar27 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar32 - 3;
        puVar7[uVar27] = uVar16 + 1;
        uVar27 = (uint)(*(int *)(data + (uVar32 - 2 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar16 = puVar7[uVar27];
        puVar19[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
                (ulong)(uVar27 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar32 - 2;
        puVar7[uVar27] = uVar16 + 1;
        uVar27 = (uint)(*(int *)(data + (uVar32 - 1 & uVar5)) * 0x1e35a7bd) >>
                 (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
        uVar16 = puVar7[uVar27];
        puVar19[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
                (ulong)(uVar27 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] =
             uVar32 - 1;
        puVar7[uVar27] = uVar16 + 1;
      }
      break;
    case 6:
      if ((6 < uVar27) && (2 < uVar32)) {
        puVar19 = (s->hasher_).privat._H5.buckets_;
        puVar6 = (s->hasher_).privat._H6.buckets_;
        uVar8 = (s->hasher_).privat._H6.hash_mul_;
        uVar33 = *(long *)(data + (uVar32 - 3 & uVar5)) * uVar8 >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 3;
        uVar33 = *(long *)(data + (uVar32 - 2 & uVar5)) * uVar8 >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 2;
        uVar33 = uVar8 * *(long *)(data + (uVar32 - 1 & uVar5)) >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 1;
      }
      break;
    case 10:
      if ((2 < uVar27) && (0x7f < uVar32)) {
        pvVar23 = (void *)((long)pvVar53 - 0x7f);
        local_9d0 = (ContextLut)((long)pvVar53 + (uVar49 - 0x7f));
        if (pvVar53 < local_9d0) {
          local_9d0 = (ContextLut)pvVar53;
        }
        local_a40 = (double)(s->hasher_).privat._H5.bucket_size_;
        local_a10 = (s->hasher_).privat._H2.buckets_;
        local_a08 = (s->hasher_).privat._H40.extra[1];
        do {
          uVar33 = (long)pvVar53 - (long)pvVar23;
          if (uVar33 < 0x10) {
            uVar33 = 0xf;
          }
          uVar49 = (ulong)((uint)pvVar23 & uVar5);
          uVar27 = (uint)(*(int *)(data + uVar49) * 0x1e35a7bd) >> 0xf;
          uVar32 = local_a10[uVar27];
          pvVar34 = (void *)(ulong)uVar32;
          local_a28 = (BrotliHasherParams *)(((ulong)local_a40 & (ulong)pvVar23) * 2 + 1);
          local_a50 = (BrotliHasherParams *)(((ulong)local_a40 & (ulong)pvVar23) * 2);
          local_a10[uVar27] = (uint)pvVar23;
          if (pvVar23 != pvVar34) {
            lVar31 = 0x40;
            uVar44 = 0;
            local_a70 = 0;
LAB_010fbaf9:
            bVar51 = lVar31 != 0;
            lVar31 = lVar31 + -1;
            if (((ulong)((long)pvVar23 - (long)pvVar34) <= (long)local_a40 - uVar33) && (bVar51)) {
              uVar27 = (uint)pvVar34 & uVar5;
              uVar47 = uVar44;
              if (local_a70 < uVar44) {
                uVar47 = local_a70;
              }
              puVar43 = data + uVar47 + uVar49;
              puVar20 = data + uVar47 + uVar27;
              uVar42 = 0x80 - uVar47;
              puVar30 = puVar43;
              if (7 < uVar42) {
                lVar29 = 0;
                lVar45 = 0;
LAB_010fbb53:
                if (*(ulong *)(puVar20 + lVar29) == *(ulong *)(puVar43 + lVar29))
                goto code_r0x010fbb60;
                uVar46 = *(ulong *)(puVar43 + lVar29) ^ *(ulong *)(puVar20 + lVar29);
                uVar42 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                lVar45 = (uVar42 >> 3 & 0x1fffffff) - lVar45;
                goto LAB_010fbbe7;
              }
              goto LAB_010fbb91;
            }
          }
LAB_010fbc50:
          iVar18 = (s->hasher_).privat._H5.hash_shift_;
          *(int *)((long)local_a08 + (long)local_a50 * 4) = iVar18;
LAB_010fbc5f:
          *(int *)((long)local_a08 + (long)local_a28 * 4) = iVar18;
          pvVar23 = (void *)((long)pvVar23 + 1);
        } while (pvVar23 < local_9d0);
      }
    }
  }
  else if (iVar18 < 0x36) {
    switch(iVar18) {
    case 0x23:
      if ((6 < uVar27) && (2 < uVar32)) {
        uVar27 = uVar32 - 3;
        puVar19 = (s->hasher_).privat._H2.buckets_;
        puVar19[(uint)(ushort)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar27 & 8) & 0xffff] = uVar27;
        uVar27 = uVar32 - 2;
        puVar19[(uint)(ushort)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar27 & 8) & 0xffff] = uVar27;
        uVar27 = uVar32 - 1;
        puVar19[(uint)(ushort)((ulong)(*(long *)(data + (uVar27 & uVar5)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar27 & 8) & 0xffff] = uVar27;
      }
      if ((uVar32 & 3) != 0) {
        uVar33 = 4 - ((ulong)pvVar53 & 3);
        bVar51 = uVar49 < uVar33;
        uVar49 = uVar49 - uVar33;
        if (bVar51) {
          uVar49 = 0;
        }
        pvVar53 = (void *)((long)pvVar53 + uVar33);
      }
      uVar44 = (ulong)((uint)pvVar53 & uVar5);
      uVar33 = mask - uVar44;
      if (uVar49 < uVar33) {
        uVar33 = uVar49;
      }
      if (0x1f < uVar33) {
        iVar18 = 0;
        uVar33 = 0xfffffffffffffffc;
        do {
          iVar18 = iVar18 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar33 + uVar44 + 4] + 1
          ;
          uVar33 = uVar33 + 4;
        } while (uVar33 < 0x1c);
LAB_010fc1e2:
        (s->hasher_).privat._H5.hash_shift_ = iVar18;
      }
LAB_010fc1e8:
      *(void **)&(s->hasher_).privat._H65.ha.num_last_distances_to_check_ = pvVar53;
      break;
    case 0x28:
    case 0x29:
      if ((2 < uVar27) && (2 < uVar32)) {
        uVar33 = (long)pvVar53 - 3;
        pvVar23 = (s->hasher_).privat._H40.extra[0];
        pvVar34 = (s->hasher_).privat._H40.extra[1];
        uVar32 = (uint)(*(int *)(data + ((uint)uVar33 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar32;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar44 = uVar33 - *(uint *)((long)pvVar23 + uVar49 * 4);
        if (0xfffe < uVar44) {
          uVar44 = 0xffff;
        }
        *(char *)((long)pvVar23 + (uVar33 & 0xffff) + 0x30000) = (char)uVar32;
        *(short *)((long)pvVar34 + (ulong)uVar16 * 4) = (short)uVar44;
        *(undefined2 *)((long)pvVar34 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar23 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar23 + uVar49 * 4) = (uint)uVar33;
        *(ushort *)((long)pvVar23 + uVar49 * 2 + 0x20000) = uVar16;
        uVar33 = (long)pvVar53 - 2;
        pvVar23 = (s->hasher_).privat._H40.extra[0];
        pvVar34 = (s->hasher_).privat._H40.extra[1];
        uVar32 = (uint)(*(int *)(data + ((uint)uVar33 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar32;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar44 = uVar33 - *(uint *)((long)pvVar23 + uVar49 * 4);
        *(char *)((long)pvVar23 + (uVar33 & 0xffff) + 0x30000) = (char)uVar32;
        if (0xfffe < uVar44) {
          uVar44 = 0xffff;
        }
        *(short *)((long)pvVar34 + (ulong)uVar16 * 4) = (short)uVar44;
        *(undefined2 *)((long)pvVar34 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar23 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar23 + uVar49 * 4) = (uint)uVar33;
        *(ushort *)((long)pvVar23 + uVar49 * 2 + 0x20000) = uVar16;
        uVar33 = (long)pvVar53 - 1;
        pvVar53 = (s->hasher_).privat._H40.extra[0];
        pvVar23 = (s->hasher_).privat._H40.extra[1];
        uVar32 = (uint)(*(int *)(data + ((uint)uVar33 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar32;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar44 = uVar33 - *(uint *)((long)pvVar53 + uVar49 * 4);
        *(char *)((long)pvVar53 + (uVar33 & 0xffff) + 0x30000) = (char)uVar32;
        if (0xfffe < uVar44) {
          uVar44 = 0xffff;
        }
        *(short *)((long)pvVar23 + (ulong)uVar16 * 4) = (short)uVar44;
        *(undefined2 *)((long)pvVar23 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar53 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar53 + uVar49 * 4) = (uint)uVar33;
        *(ushort *)((long)pvVar53 + uVar49 * 2 + 0x20000) = uVar16;
      }
      break;
    case 0x2a:
      if ((2 < uVar27) && (2 < uVar32)) {
        uVar33 = (long)pvVar53 - 3;
        pvVar23 = (s->hasher_).privat._H42.extra[0];
        uVar27 = (uint)(*(int *)(data + ((uint)uVar33 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar27;
        uVar32 = uVar27 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2);
        pvVar34 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2) = uVar16 + 1;
        uVar44 = (ulong)uVar16 & 0x1ff;
        uVar47 = uVar33 - *(uint *)((long)pvVar23 + uVar49 * 4);
        *(char *)((long)pvVar23 + (uVar33 & 0xffff) + 0x30000) = (char)uVar27;
        if (0xfffe < uVar47) {
          uVar47 = 0xffff;
        }
        *(short *)((long)pvVar34 + uVar44 * 4 + (ulong)(uVar32 << 0xb)) = (short)uVar47;
        *(undefined2 *)((long)pvVar34 + uVar44 * 4 + (ulong)(uVar32 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar23 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar23 + uVar49 * 4) = (uint)uVar33;
        *(short *)((long)pvVar23 + uVar49 * 2 + 0x20000) = (short)uVar44;
        uVar33 = (long)pvVar53 - 2;
        pvVar23 = (s->hasher_).privat._H42.extra[0];
        uVar32 = (uint)(*(int *)(data + ((uint)uVar33 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar32;
        uVar27 = uVar32 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar27 * 2);
        pvVar34 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar27 * 2) = uVar16 + 1;
        uVar44 = (ulong)uVar16 & 0x1ff;
        uVar47 = uVar33 - *(uint *)((long)pvVar23 + uVar49 * 4);
        *(char *)((long)pvVar23 + (uVar33 & 0xffff) + 0x30000) = (char)uVar32;
        if (0xfffe < uVar47) {
          uVar47 = 0xffff;
        }
        *(short *)((long)pvVar34 + uVar44 * 4 + (ulong)(uVar27 << 0xb)) = (short)uVar47;
        *(undefined2 *)((long)pvVar34 + uVar44 * 4 + (ulong)(uVar27 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar23 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar23 + uVar49 * 4) = (uint)uVar33;
        *(short *)((long)pvVar23 + uVar49 * 2 + 0x20000) = (short)uVar44;
        uVar47 = (long)pvVar53 - 1;
        pvVar53 = (s->hasher_).privat._H42.extra[0];
        uVar27 = (uint)(*(int *)(data + ((uint)uVar47 & uVar5)) * 0x1e35a7bd) >> 0x11;
        uVar49 = (ulong)uVar27;
        uVar32 = uVar27 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2);
        pvVar23 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2) = uVar16 + 1;
        uVar44 = (ulong)uVar16 & 0x1ff;
        uVar33 = uVar47 - *(uint *)((long)pvVar53 + uVar49 * 4);
        *(char *)((long)pvVar53 + (uVar47 & 0xffff) + 0x30000) = (char)uVar27;
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        *(short *)((long)pvVar23 + uVar44 * 4 + (ulong)(uVar32 << 0xb)) = (short)uVar33;
        *(undefined2 *)((long)pvVar23 + uVar44 * 4 + (ulong)(uVar32 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar53 + uVar49 * 2 + 0x20000);
        *(uint *)((long)pvVar53 + uVar49 * 4) = (uint)uVar47;
        *(short *)((long)pvVar53 + uVar49 * 2 + 0x20000) = (short)uVar44;
      }
    }
  }
  else if (iVar18 == 0x36) {
    if ((6 < uVar27) && (2 < uVar32)) {
      uVar27 = uVar32 - 3;
      puVar19 = (s->hasher_).privat._H2.buckets_;
      uVar17 = 0xfffff;
      puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c) +
              (uVar27 & 0x18) & 0xfffff] = uVar27;
      uVar27 = uVar32 - 2;
      puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c) +
              (uVar27 & 0x18) & 0xfffff] = uVar27;
      uVar27 = (uint)((ulong)(*(long *)(data + (uVar32 - 1 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c)
      ;
      goto LAB_010fc0df;
    }
  }
  else {
    if (iVar18 == 0x37) {
      if ((6 < uVar27) && (2 < uVar32)) {
        uVar27 = uVar32 - 3;
        puVar19 = (s->hasher_).privat._H2.buckets_;
        puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar27 & 0x18) & 0xfffff] = uVar27;
        uVar27 = uVar32 - 2;
        puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar27 & 0x18) & 0xfffff] = uVar27;
        uVar27 = uVar32 - 1;
        puVar19[(uint)((ulong)(*(long *)(data + (uVar27 & uVar5)) * -0x1ca5842ca8642d00) >> 0x2c) +
                (uVar27 & 0x18) & 0xfffff] = uVar27;
      }
      if ((uVar32 & 3) != 0) {
        uVar33 = 4 - ((ulong)pvVar53 & 3);
        bVar51 = uVar49 < uVar33;
        uVar49 = uVar49 - uVar33;
        if (bVar51) {
          uVar49 = 0;
        }
        pvVar53 = (void *)((long)pvVar53 + uVar33);
      }
      uVar44 = (ulong)((uint)pvVar53 & uVar5);
      uVar33 = mask - uVar44;
      if (uVar49 < uVar33) {
        uVar33 = uVar49;
      }
      if (0x1f < uVar33) {
        iVar18 = 0;
        uVar33 = 0xfffffffffffffffc;
        do {
          iVar18 = iVar18 * (s->hasher_).privat._H35.hb.factor + (uint)data[uVar33 + uVar44 + 4] + 1
          ;
          uVar33 = uVar33 + 4;
        } while (uVar33 < 0x1c);
        goto LAB_010fc1e2;
      }
      goto LAB_010fc1e8;
    }
    if (iVar18 == 0x41) {
      if ((6 < uVar27) && (2 < uVar32)) {
        puVar19 = (s->hasher_).privat._H5.buckets_;
        puVar6 = (s->hasher_).privat._H6.buckets_;
        uVar8 = (s->hasher_).privat._H6.hash_mul_;
        uVar33 = *(long *)(data + (uVar32 - 3 & uVar5)) * uVar8 >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 3;
        uVar33 = *(long *)(data + (uVar32 - 2 & uVar5)) * uVar8 >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 2;
        uVar33 = uVar8 * *(long *)(data + (uVar32 - 1 & uVar5)) >> 0x31;
        uVar16 = *(ushort *)((long)puVar19 + uVar33 * 2);
        uVar27 = (s->hasher_).privat._H6.block_mask_;
        bVar24 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
        *(ushort *)((long)puVar19 + uVar33 * 2) = uVar16 + 1;
        puVar6[(uVar33 << (bVar24 & 0x3f)) + (ulong)(uVar27 & uVar16)] = uVar32 - 1;
      }
      uVar33 = mask - (uVar5 & uVar32);
      if (uVar49 <= uVar33) {
        uVar33 = uVar49;
      }
      if (0x1f < (uint)uVar33) {
        lVar31 = 0;
        uVar35 = 0;
        do {
          uVar35 = uVar35 * (s->hasher_).privat._H65.hb.factor +
                   (uint)data[lVar31 + (ulong)(uVar5 & uVar32)] + 1;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0x20);
        (s->hasher_).privat._H65.hb.state = uVar35;
      }
      (s->hasher_).privat._H35.ha_common.extra[3] = pvVar53;
    }
  }
  uVar33 = s->last_flush_pos_;
  uVar32 = (uint)uVar33;
  if (0xbfffffff < uVar33) {
    uVar32 = ((int)(uVar32 * 2) >> 1 & 0xc0000000U) + (uVar32 & 0x3fffffff) + 0x80000000;
  }
  psVar39 = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar18 = duckdb_brotli::BrotliIsMostlyUTF8
                         (data,(ulong)uVar32,mask,s->input_pos_ - uVar33,0.75), iVar18 != 0)) {
    literal_context_mode = CONTEXT_UTF8;
  }
  else {
    literal_context_mode = CONTEXT_SIGNED;
  }
  if ((*psVar39 != 0) && (s->last_insert_len_ == 0)) {
    ExtendLastCommand(s,&bytes,&wrapped_last_processed_pos);
  }
  local_9d0 = &duckdb_brotli::_kBrotliContextLookupTable + (literal_context_mode << 9);
  iVar18 = (s->params).quality;
  uVar49 = (ulong)bytes;
  uVar33 = (ulong)wrapped_last_processed_pos;
  piVar21 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar22 = s->commands_ + s->num_commands_;
  num_literals = &s->num_literals_;
  if (iVar18 == 0xb) {
    duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
              (m,uVar49,uVar33,data,mask,local_9d0,&s->params,hasher,piVar21,last_insert_len,pCVar22
               ,psVar39,num_literals);
  }
  else if (iVar18 == 10) {
    duckdb_brotli::BrotliCreateZopfliBackwardReferences
              (m,uVar49,uVar33,data,mask,local_9d0,&s->params,hasher,piVar21,last_insert_len,pCVar22
               ,psVar39,num_literals);
  }
  else {
    duckdb_brotli::BrotliCreateBackwardReferences
              (uVar49,uVar33,data,mask,local_9d0,&s->params,hasher,piVar21,last_insert_len,pCVar22,
               psVar39,num_literals);
  }
  iVar18 = (s->params).lgwin;
  iVar26 = (s->params).lgblock;
  if (iVar18 <= iVar26) {
    iVar18 = iVar26;
  }
  cVar25 = '\x17';
  if (iVar18 < 0x17) {
    cVar25 = (char)iVar18;
  }
  uVar33 = 1L << (cVar25 + 1U & 0x3f);
  uVar8 = s->input_pos_;
  uVar9 = s->last_flush_pos_;
  if ((s->params).quality < 4) {
    bVar51 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar51 = false;
  }
  uVar49 = uVar8 - uVar9;
  if (((((int)local_9f0 == 0 && (int)local_a38 == 0) && (!bVar51)) &&
      ((1L << ((byte)iVar26 & 0x3f)) + uVar49 <= uVar33)) &&
     ((uVar33 = uVar33 >> 3, s->num_literals_ < uVar33 && (*psVar39 < uVar33)))) {
    iVar18 = UpdateLastProcessedPos(s);
    if (iVar18 != 0) {
      *local_9e0 = 0;
    }
    *local_9d8 = 0;
    return 1;
  }
  uVar33 = s->last_insert_len_;
  if (uVar33 != 0) {
    pCVar22 = s->commands_;
    sVar37 = s->num_commands_;
    s->num_commands_ = sVar37 + 1;
    pCVar22[sVar37].insert_len_ = (uint32_t)uVar33;
    pCVar22[sVar37].copy_len_ = 0x8000000;
    pCVar22[sVar37].dist_extra_ = 0;
    pCVar22[sVar37].dist_prefix_ = 0x10;
    if (uVar33 < 6) {
      uVar44 = uVar33 & 0xffffffff;
    }
    else if (uVar33 < 0x82) {
      uVar32 = 0x1f;
      uVar27 = (uint)(uVar33 - 2);
      if (uVar27 != 0) {
        for (; uVar27 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar44 = (ulong)((int)(uVar33 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar32 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar33 < 0x842) {
      uVar27 = (uint32_t)uVar33 - 0x42;
      uVar32 = 0x1f;
      if (uVar27 != 0) {
        for (; uVar27 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar44 = (ulong)((uVar32 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar44 = 0x15;
      if (0x1841 < uVar33) {
        uVar44 = (ulong)(ushort)(0x17 - (uVar33 < 0x5842));
      }
    }
    iVar18 = (int)((uVar44 & 0xffff) >> 3) * 3;
    pCVar22[sVar37].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar18 * 0x40 +
         ((ushort)uVar44 & 7) * 8 + 0x42;
    s->num_literals_ = s->num_literals_ + uVar33;
    s->last_insert_len_ = 0;
  }
  out_size = local_9d8;
  if (uVar8 == uVar9 && (int)local_a38 == 0) {
LAB_010fc54b:
    *out_size = 0;
    return 1;
  }
  puVar20 = GetBrotliStorage(s,(ulong)((uint)uVar49 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s->last_bytes_bits_;
  uVar4 = (uint8_t)s->last_bytes_;
  *puVar20 = uVar4;
  uVar2 = *(uint8_t *)((long)&s->last_bytes_ + 1);
  local_a28 = (BrotliHasherParams *)CONCAT71(local_a28._1_7_,uVar2);
  puVar20[1] = uVar2;
  uVar33 = s->last_flush_pos_;
  uVar44 = uVar49 & 0xffffffff;
  uVar32 = (uint)uVar33;
  if (0xbfffffff < uVar33) {
    uVar32 = ((int)(uVar32 * 2) >> 1 & 0xc0000000U) + (uVar32 & 0x3fffffff) + 0x80000000;
  }
  local_a10 = (uint32_t *)CONCAT44(local_a10._4_4_,uVar32);
  bVar24 = s->prev_byte_;
  bVar3 = s->prev_byte2_;
  sVar37 = s->num_literals_;
  local_a00 = s->commands_;
  local_9f8 = s->num_commands_;
  local_9f0 = s->saved_dist_cache_;
  switchD_00b041bd::default(&storage_ix,s,0x578);
  if (uVar44 == 0) {
    *(ulong *)(puVar20 + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) | (ulong)puVar20[storage_ix_1 >> 3];
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    ppuVar48 = local_a30;
    piVar50 = local_9f0;
    goto LAB_010fcd38;
  }
  uVar47 = uVar44;
  if ((uint)uVar49 < 3) {
LAB_010fc650:
    piVar50 = local_9f0;
    uVar12 = *(undefined8 *)(local_9f0 + 2);
    *(undefined8 *)piVar21 = *(undefined8 *)local_9f0;
    *(undefined8 *)(s->dist_cache_ + 2) = uVar12;
    duckdb_brotli::BrotliStoreUncompressedMetaBlock
              ((int)local_a38,data,(ulong)local_a10 & 0xffffffff,mask,uVar47,&storage_ix_1,puVar20);
    ppuVar48 = local_a30;
  }
  else {
    local_a18 = uVar44;
    if ((local_9f8 < (uVar49 >> 8 & 0xffffff) + 2) &&
       (auVar55._8_4_ = (int)(sVar37 >> 0x20), auVar55._0_8_ = sVar37, auVar55._12_4_ = 0x45300000,
       (double)uVar44 * 0.99 <
       (auVar55._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar37) - 4503599627370496.0))) {
      switchD_00569a20::default(&table_size,0,0x400);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_a18 + 0xc;
      lVar31 = SUB168(auVar10 * ZEXT816(0x13b13b13b13b13b2),8);
      do {
        auStack_430[(ulong)data[(uint)uVar33 & uVar5] - 2] =
             auStack_430[(ulong)data[(uint)uVar33 & uVar5] - 2] + 1;
        uVar33 = (ulong)((uint)uVar33 + 0xd);
        lVar31 = lVar31 + -1;
      } while (lVar31 != 0);
      dVar57 = 0.0;
      uVar33 = 0xfffffffffffffff8;
      uVar49 = 0;
      do {
        uVar47 = (ulong)*(uint *)((long)auStack_430 + uVar33);
        local_a28 = (BrotliHasherParams *)(double)uVar47;
        if (uVar47 < 0x100) {
          pvVar53 = (void *)(&duckdb_brotli::kBrotliLog2Table)[uVar47];
        }
        else {
          pvVar53 = (void *)log2((double)local_a28);
        }
        uVar42 = (ulong)*(uint *)((long)auStack_430 + uVar33 + 4);
        dVar59 = (double)uVar42;
        if (uVar42 < 0x100) {
          dVar54 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar42];
        }
        else {
          local_a40 = dVar59;
          local_a08 = pvVar53;
          dVar54 = log2(dVar59);
          pvVar53 = local_a08;
          dVar59 = local_a40;
        }
        uVar49 = uVar49 + uVar47 + uVar42;
        dVar57 = (dVar57 - (double)local_a28 * (double)pvVar53) - dVar59 * dVar54;
        uVar33 = uVar33 + 8;
      } while (uVar33 < 0x3f8);
      auVar56._8_4_ = (int)(uVar49 >> 0x20);
      auVar56._0_8_ = uVar49;
      auVar56._12_4_ = 0x45300000;
      dVar59 = auVar56._8_8_ - 1.9342813113834067e+25;
      pBVar58 = (BrotliHasherParams *)
                (dVar59 + ((double)CONCAT44(0x43300000,(int)uVar49) - 4503599627370496.0));
      if (uVar49 != 0) {
        if (uVar49 < 0x100) {
          dVar59 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar49];
        }
        else {
          local_a28 = pBVar58;
          dStack_a20 = dVar59;
          dVar59 = log2((double)pBVar58);
          pBVar58 = local_a28;
        }
        dVar57 = dVar57 + dVar59 * (double)pBVar58;
      }
      if ((double)pBVar58 <= dVar57) {
        pBVar58 = (BrotliHasherParams *)dVar57;
      }
      uVar47 = local_a18;
      if (((double)uVar44 * 7.92) / 13.0 < (double)pBVar58) goto LAB_010fc650;
      uVar4 = *puVar20;
      local_a28 = (BrotliHasherParams *)CONCAT71(local_a28._1_7_,puVar20[1]);
    }
    sVar37 = local_a18;
    ppuVar48 = local_a30;
    uVar33 = storage_ix_1 & 0xff;
    iVar18 = (s->params).quality;
    if (iVar18 < 3) {
      duckdb_brotli::BrotliStoreMetaBlockFast
                (m,data,(ulong)local_a10 & 0xffffffff,local_a18,mask,(int)local_a38,&s->params,
                 local_a00,local_9f8,&storage_ix_1,puVar20);
      ppuVar48 = local_a30;
    }
    else if (iVar18 == 3) {
      duckdb_brotli::BrotliStoreMetaBlockTrivial
                (m,data,(ulong)local_a10 & 0xffffffff,local_a18,mask,(int)local_a38,&s->params,
                 local_a00,local_9f8,&storage_ix_1,puVar20);
    }
    else {
      duckdb_brotli::BrotliInitBlockSplit((BlockSplit *)&table_size);
      duckdb_brotli::BrotliInitBlockSplit(&local_408);
      duckdb_brotli::BrotliInitBlockSplit(&local_3d8);
      local_368 = (HistogramDistance *)0x0;
      sStack_360 = 0;
      local_378 = (HistogramCommand *)0x0;
      sStack_370 = 0;
      local_388 = (HistogramLiteral *)0x0;
      sStack_380 = 0;
      local_398 = (uint32_t *)0x0;
      sStack_390 = 0;
      local_3a8 = (uint32_t *)0x0;
      sStack_3a0 = 0;
      uVar49 = (ulong)local_a10 & 0xffffffff;
      local_a08 = (void *)(ulong)bVar3;
      if ((s->params).quality < 10) {
        local_a40 = (double)CONCAT44(local_a40._4_4_,(uint)bVar24);
        num_literal_contexts = 1;
        local_9c8 = (uint32_t *)0x0;
        if ((s->params).disable_literal_context_modeling == 0) {
          puVar19 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x700);
          DecideOverLiteralContextModeling
                    (data,uVar49,local_a18,mask,(s->params).quality,(s->params).size_hint,
                     &num_literal_contexts,&local_9c8,puVar19);
          duckdb_brotli::BrotliFree(m,puVar19);
        }
        ppuVar48 = local_a30;
        bVar24 = SUB81(local_a40,0);
        duckdb_brotli::BrotliBuildMetaBlockGreedy
                  (m,data,uVar49,mask,bVar24,(uint8_t)local_a08,local_9d0,num_literal_contexts,
                   local_9c8,local_a00,local_9f8,(MetaBlockSplit *)&table_size);
      }
      else {
        duckdb_brotli::BrotliBuildMetaBlock
                  (m,data,uVar49,mask,(BrotliEncoderParams *)&storage_ix,bVar24,bVar3,local_a00,
                   local_9f8,literal_context_mode,(MetaBlockSplit *)&table_size);
        ppuVar48 = local_a30;
      }
      if (3 < (s->params).quality) {
        duckdb_brotli::BrotliOptimizeHistograms(local_974,(MetaBlockSplit *)&table_size);
      }
      duckdb_brotli::BrotliStoreMetaBlock
                (m,data,uVar49,local_a18,mask,bVar24,(uint8_t)local_a08,(int)local_a38,
                 (BrotliEncoderParams *)&storage_ix,literal_context_mode,local_a00,local_9f8,
                 (MetaBlockSplit *)&table_size,&storage_ix_1,puVar20);
      duckdb_brotli::BrotliDestroyBlockSplit(m,(BlockSplit *)&table_size);
      duckdb_brotli::BrotliDestroyBlockSplit(m,&local_408);
      duckdb_brotli::BrotliDestroyBlockSplit(m,&local_3d8);
      duckdb_brotli::BrotliFree(m,local_3a8);
      local_3a8 = (uint32_t *)0x0;
      duckdb_brotli::BrotliFree(m,local_398);
      local_398 = (uint32_t *)0x0;
      duckdb_brotli::BrotliFree(m,local_388);
      local_388 = (HistogramLiteral *)0x0;
      duckdb_brotli::BrotliFree(m,local_378);
      sVar37 = local_a18;
      local_378 = (HistogramCommand *)0x0;
      duckdb_brotli::BrotliFree(m,local_368);
    }
    piVar50 = local_9f0;
    if (sVar37 + 4 < storage_ix_1 >> 3) {
      uVar12 = *(undefined8 *)(local_9f0 + 2);
      *(undefined8 *)piVar21 = *(undefined8 *)local_9f0;
      *(undefined8 *)(s->dist_cache_ + 2) = uVar12;
      *puVar20 = uVar4;
      puVar20[1] = (uint8_t)local_a28;
      storage_ix_1 = uVar33;
      duckdb_brotli::BrotliStoreUncompressedMetaBlock
                ((int)local_a38,data,(ulong)local_a10 & 0xffffffff,mask,sVar37,&storage_ix_1,puVar20
                );
    }
  }
LAB_010fcd38:
  uVar33 = storage_ix_1 >> 3;
  s->last_bytes_ = (ushort)puVar20[uVar33];
  s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  s->last_flush_pos_ = s->input_pos_;
  iVar18 = UpdateLastProcessedPos(s);
  if (iVar18 != 0) {
    *local_9e0 = 0;
  }
  uVar8 = s->last_flush_pos_;
  if (uVar8 != 0) {
    s->prev_byte_ = data[uVar5 & (int)uVar8 - 1U];
    if (uVar8 != 1) {
      s->prev_byte2_ = data[uVar5 & (int)uVar8 - 2U];
    }
  }
  *psVar39 = 0;
  s->num_literals_ = 0;
  uVar12 = *(undefined8 *)(s->dist_cache_ + 2);
  *(undefined8 *)piVar50 = *(undefined8 *)piVar21;
  *(undefined8 *)(piVar50 + 2) = uVar12;
  *ppuVar48 = puVar20;
  *local_9d8 = uVar33;
  return 1;
code_r0x010fbb60:
  lVar29 = lVar29 + 8;
  lVar1 = uVar42 + lVar45;
  lVar45 = lVar45 + -8;
  if (lVar1 - 8U < 8) goto code_r0x010fbb76;
  goto LAB_010fbb53;
code_r0x010fbb76:
  puVar20 = puVar20 + -lVar45;
  uVar42 = uVar42 + lVar45;
  puVar30 = puVar43 + -lVar45;
LAB_010fbb91:
  if (uVar42 != 0) {
    uVar46 = 0;
    do {
      uVar11 = uVar46;
      if (puVar30[uVar46] != puVar20[uVar46]) break;
      uVar46 = uVar46 + 1;
      uVar11 = uVar42;
    } while (uVar42 != uVar46);
    puVar30 = puVar30 + uVar11;
  }
  lVar45 = (long)puVar30 - (long)puVar43;
LAB_010fbbe7:
  uVar47 = lVar45 + uVar47;
  if (0x7f < uVar47) {
    *(undefined4 *)((long)local_a08 + (long)local_a50 * 4) =
         *(undefined4 *)((long)local_a08 + ((ulong)pvVar34 & (ulong)local_a40) * 8);
    iVar18 = *(int *)((long)local_a08 + ((ulong)pvVar34 & (ulong)local_a40) * 8 + 4);
    goto LAB_010fbc5f;
  }
  pBVar58 = (BrotliHasherParams *)(((ulong)pvVar34 & (ulong)local_a40) * 2);
  if (data[uVar47 + uVar27] < data[uVar47 + uVar49]) {
    *(uint *)((long)local_a08 + (long)local_a50 * 4) = uVar32;
    pBVar58 = (BrotliHasherParams *)((ulong)pBVar58 | 1);
    local_a70 = uVar47;
    local_a50 = pBVar58;
  }
  else {
    *(uint *)((long)local_a08 + (long)local_a28 * 4) = uVar32;
    uVar44 = uVar47;
    local_a28 = pBVar58;
  }
  uVar32 = *(uint *)((long)local_a08 + (long)pBVar58 * 4);
  pvVar34 = (void *)(ulong)uVar32;
  if (pvVar23 == pvVar34) goto LAB_010fbc50;
  goto LAB_010fbaf9;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;
  BROTLI_BOOL fast_compress =
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  if (delta == 0) {  /* No new input; still might want to flush or finish. */
    if (!data) {  /* No input has been processed so far. */
      if (is_last) {  /* Emit complete finalized stream. */
        BROTLI_DCHECK(s->last_bytes_bits_ <= 14);
        s->last_bytes_ |= (uint16_t)(3u << s->last_bytes_bits_);
        s->last_bytes_bits_ = (uint8_t)(s->last_bytes_bits_ + 2u);
        s->tiny_buf_.u8[0] = (uint8_t)s->last_bytes_;
        s->tiny_buf_.u8[1] = (uint8_t)(s->last_bytes_ >> 8);
        *output = s->tiny_buf_.u8;
        *out_size = (s->last_bytes_bits_ + 7u) >> 3u;
        return BROTLI_TRUE;
      } else {  /* No data, not last -> no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    } else {
      /* Fast compress performs flush every block -> flush is no-op. */
      if (!is_last && (!force_flush || fast_compress)) {  /* Another no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    }
  }
  BROTLI_DCHECK(data);

  if (s->params.quality > s->params.dictionary.max_quality) return BROTLI_FALSE;
  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (fast_compress) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          s->one_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          s->two_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO(eustas): Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}